

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest::ExpectHasEarlyExitErrors
          (ParserTest *this,string_view text,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *expected_errors)

{
  bool bVar1;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *matcher
  ;
  pointer *__ptr;
  char *message;
  char *in_R9;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  AssertHelper local_1a0;
  AssertionResult gtest_ar_;
  string local_188;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  SourceLocationTable source_locations;
  FileDescriptorProto file;
  
  SetupParser(this,text);
  SourceLocationTable::SourceLocationTable(&source_locations);
  ((this->parser_)._M_t.
   super___uniq_ptr_impl<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
   ._M_t.
   super__Tuple_impl<0UL,_google::protobuf::compiler::Parser_*,_std::default_delete<google::protobuf::compiler::Parser>_>
   .super__Head_base<0UL,_google::protobuf::compiler::Parser_*,_false>._M_head_impl)->
  source_location_table_ = &source_locations;
  FileDescriptorProto::FileDescriptorProto(&file);
  bVar1 = Parser::Parse((this->parser_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::Parser_*,_std::default_delete<google::protobuf::compiler::Parser>_>
                        .super__Head_base<0UL,_google::protobuf::compiler::Parser_*,_false>.
                        _M_head_impl,
                        (this->input_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::io::Tokenizer_*,_std::default_delete<google::protobuf::io::Tokenizer>_>
                        .super__Head_base<0UL,_google::protobuf::io::Tokenizer_*,_false>.
                        _M_head_impl,&file);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)&gtest_ar_,
               (AssertionResult *)"parser_->Parse(input_.get(), &file)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xa2,local_188._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_188);
    if (local_1a8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_1a8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_168,expected_errors);
  testing::internal::MakePredicateFormatterFromMatcher<testing::Matcher<std::__cxx11::string>>
            ((PredicateFormatterFromMatcher<testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_188,(internal *)&local_168,matcher);
  testing::internal::PredicateFormatterFromMatcher<testing::Matcher<std::__cxx11::string>>::
  operator()(&gtest_ar_,(char *)&local_188,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "error_collector_.text_");
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_188);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_168);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_188);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xa3,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if ((long *)local_188._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_188._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  FileDescriptorProto::~FileDescriptorProto(&file);
  SourceLocationTable::~SourceLocationTable(&source_locations);
  return;
}

Assistant:

void ExpectHasEarlyExitErrors(
      absl::string_view text,
      const testing::Matcher<std::string>& expected_errors) {
    SetupParser(text);
    SourceLocationTable source_locations;
    parser_->RecordSourceLocationsTo(&source_locations);
    FileDescriptorProto file;
    EXPECT_FALSE(parser_->Parse(input_.get(), &file));
    EXPECT_THAT(error_collector_.text_, expected_errors);
  }